

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

bool __thiscall
basist::basisu_transcoder::transcode_image_level
          (basisu_transcoder *this,void *pData,uint32_t data_size,uint32_t image_index,
          uint32_t level_index,void *pOutput_blocks,
          uint32_t output_blocks_buf_size_in_blocks_or_pixels,transcoder_texture_format fmt,
          uint32_t decode_flags,uint32_t output_row_pitch_in_blocks_or_pixels,
          basisu_transcoder_state *pState,uint32_t output_rows_in_pixels)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  int iVar5;
  transcoder_texture_format tVar6;
  uint32_t uVar7;
  uint uVar8;
  basisu_lowlevel_uastc_transcoder *pbVar9;
  uint32_t in_ECX;
  uint32_t unaff_EBX;
  uint32_t unaff_EBP;
  basisu_lowlevel_uastc_transcoder *in_RSI;
  long in_RDI;
  long in_R9;
  uint32_t unaff_R12D;
  uint32_t unaff_R13D;
  basisu_transcoder_state *unaff_R14;
  uint32_t unaff_R15D;
  int unaff_retaddr;
  uint in_stack_00000008;
  uint32_t in_stack_00000010;
  uint in_stack_00000018;
  undefined4 in_stack_0000001c;
  uint32_t in_stack_00000020;
  undefined8 in_stack_00000028;
  basis_slice_desc *pAlpha_slice_desc;
  basis_slice_desc *pSlice_desc_1;
  basis_slice_desc *pSlice_desc;
  uint32_t total_slice_blocks;
  bool status;
  int slice_index;
  bool basis_file_has_alpha_slices;
  basis_slice_desc *pSlice_descs;
  uint8_t *pDataU8;
  basis_file_header *pHeader;
  uint32_t bytes_per_block_or_pixel;
  transcoder_texture_format in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  uint32_t in_stack_fffffffffffffe1c;
  undefined4 in_stack_fffffffffffffe20;
  uint32_t in_stack_fffffffffffffe24;
  uint32_t in_stack_fffffffffffffe28;
  uint32_t in_stack_fffffffffffffe2c;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  basisu_lowlevel_uastc_transcoder *local_120;
  uint32_t in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  undefined2 uVar10;
  transcoder_texture_format in_stack_ffffffffffffff44;
  basisu_lowlevel_uastc_transcoder *pbVar11;
  uint32_t output_blocks_buf_size_in_blocks_or_pixels_00;
  basisu_lowlevel_etc1s_transcoder *in_stack_ffffffffffffff68;
  bool local_89;
  basisu_lowlevel_uastc_transcoder *pbVar12;
  uint32_t in_stack_ffffffffffffff98;
  uint32_t in_stack_ffffffffffffffa8;
  uint32_t num_blocks_y;
  uint32_t orig_width;
  long lVar13;
  uint32_t in_stack_ffffffffffffffc8;
  
  uVar10 = (undefined2)((uint)in_stack_ffffffffffffff40 >> 0x10);
  lVar13 = in_RDI;
  uVar2 = basis_get_bytes_per_block_or_pixel(in_stack_fffffffffffffe00);
  orig_width = (uint32_t)lVar13;
  if ((*(byte *)(in_RDI + 0x311) & 1) == 0) {
    return false;
  }
  if ((in_stack_00000018 & 2) != 0) {
    return false;
  }
  bVar1 = validate_header_quick
                    ((basisu_transcoder *)
                     CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                     (void *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                     in_stack_fffffffffffffe1c);
  output_blocks_buf_size_in_blocks_or_pixels_00 = (uint32_t)((ulong)in_RDI >> 0x20);
  if (!bVar1) {
    return false;
  }
  pbVar12 = in_RSI;
  pbVar11 = in_RSI;
  uVar3 = basisu::packed_uint::operator_cast_to_unsigned_int
                    ((packed_uint<4U> *)
                     CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  num_blocks_y = (uint32_t)pbVar11;
  pbVar11 = in_RSI;
  uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(pbVar12 + 0x15));
  bVar1 = (uVar4 & 4) != 0;
  iVar5 = find_first_slice_index
                    ((basisu_transcoder *)
                     CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                     (void *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                     in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28,in_stack_fffffffffffffe24);
  if (iVar5 < 0) {
    return false;
  }
  if ((in_stack_00000010 == 9) && (!bVar1)) {
    in_stack_00000010 = 8;
  }
  uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(pbVar12 + 0x14));
  if (uVar4 == 0) {
    uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int
                      ((packed_uint *)(in_RSI + (long)iVar5 * 0x17 + (ulong)uVar3 + 4));
    if ((uVar4 & 1) != 0) {
      return false;
    }
    if (bVar1) {
      in_stack_ffffffffffffff44 = iVar5 + cTFETC2;
      tVar6 = basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(pbVar12 + 0xe));
      if (tVar6 <= in_stack_ffffffffffffff44) {
        return false;
      }
      uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int
                        ((packed_uint *)(in_RSI + (long)(iVar5 + 1) * 0x17 + (ulong)uVar3 + 4));
      if ((uVar4 & 1) == 0) {
        return false;
      }
      uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int
                        ((packed_uint *)(in_RSI + (long)iVar5 * 0x17 + (ulong)uVar3 + 9));
      uVar7 = basisu::packed_uint::operator_cast_to_unsigned_int
                        ((packed_uint *)(in_RSI + (long)(iVar5 + 1) * 0x17 + (ulong)uVar3 + 9));
      if (uVar4 == uVar7) {
        in_stack_ffffffffffffff3c =
             basisu::packed_uint::operator_cast_to_unsigned_int
                       ((packed_uint *)(in_RSI + (long)iVar5 * 0x17 + (ulong)uVar3 + 0xb));
        uVar10 = (undefined2)(uVar4 >> 0x10);
        uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int
                          ((packed_uint *)(in_RSI + (long)(iVar5 + 1) * 0x17 + (ulong)uVar3 + 0xb));
        if (in_stack_ffffffffffffff3c == uVar4) goto LAB_001b40fc;
      }
      return false;
    }
  }
LAB_001b40fc:
  uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int
                    ((packed_uint *)(in_RSI + (long)iVar5 * 0x17 + (ulong)uVar3 + 9));
  uVar7 = basisu::packed_uint::operator_cast_to_unsigned_int
                    ((packed_uint *)(in_RSI + (long)iVar5 * 0x17 + (ulong)uVar3 + 0xb));
  uVar8 = uVar4 * uVar7;
  if (((in_stack_00000010 == 8) || (in_stack_00000010 == 9)) && (uVar8 < in_stack_00000008)) {
    memset((void *)(in_R9 + (ulong)(uVar8 * uVar2)),0,(ulong)((in_stack_00000008 - uVar8) * uVar2));
  }
  uVar7 = (uint32_t)in_R9;
  uVar2 = basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(pbVar12 + 0x14));
  if (uVar2 == 1) {
    in_RSI = in_RSI + (long)iVar5 * 0x17 + (ulong)uVar3;
    basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(in_RSI + 9));
    basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(in_RSI + 0xb));
    basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(in_RSI + 5));
    basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(in_RSI + 7));
    basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(in_RSI + 3));
    basisu::packed_uint::operator_cast_to_unsigned_int
              ((packed_uint<4U> *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    basisu::packed_uint::operator_cast_to_unsigned_int
              ((packed_uint<4U> *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(pbVar12 + 0x17));
    local_89 = basisu_lowlevel_uastc_transcoder::transcode_image
                         (pbVar11,in_stack_ffffffffffffff44,
                          (void *)CONCAT44(in_stack_ffffffffffffff3c,uVar4),in_stack_00000008,
                          (uint8_t *)CONCAT44(in_stack_00000018,in_stack_00000020),
                          (uint32_t)((ulong)in_stack_00000028 >> 0x20),(uint32_t)pbVar12,
                          in_stack_ffffffffffffff98,uVar7,in_stack_ffffffffffffffa8,in_ECX,
                          num_blocks_y,orig_width,in_stack_ffffffffffffffc8,
                          SUB81((ulong)in_stack_00000028 >> 0x18,0),
                          SUB81((ulong)in_stack_00000028 >> 0x10,0),unaff_R13D,unaff_R14,unaff_R15D,
                          unaff_EBP,unaff_retaddr);
  }
  else {
    pbVar9 = in_RSI + (long)iVar5 * 0x17 + (ulong)uVar3;
    if (bVar1) {
      local_120 = in_RSI + (long)(iVar5 + 1) * 0x17 + (ulong)uVar3;
    }
    else {
      local_120 = (basisu_lowlevel_uastc_transcoder *)0x0;
    }
    uVar2 = basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(pbVar9 + 4));
    uVar3 = (uint32_t)unaff_R14;
    if ((uVar2 & 1) != 0) {
      __assert_fail("(pSlice_desc->m_flags & cSliceDescFlagsHasAlpha) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                    ,0x2a0a,
                    "bool basist::basisu_transcoder::transcode_image_level(const void *, uint32_t, uint32_t, uint32_t, void *, uint32_t, transcoder_texture_format, uint32_t, uint32_t, basisu_transcoder_state *, uint32_t) const"
                   );
    }
    if (local_120 != (basisu_lowlevel_uastc_transcoder *)0x0) {
      uVar2 = basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(local_120 + 4));
      if ((uVar2 & 1) == 0) {
        __assert_fail("(pAlpha_slice_desc->m_flags & cSliceDescFlagsHasAlpha) != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                      ,0x2a0f,
                      "bool basist::basisu_transcoder::transcode_image_level(const void *, uint32_t, uint32_t, uint32_t, void *, uint32_t, transcoder_texture_format, uint32_t, uint32_t, basisu_transcoder_state *, uint32_t) const"
                     );
      }
      uVar2 = basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(pbVar9 + 9));
      uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(local_120 + 9));
      if (uVar2 != uVar4) {
        __assert_fail("pSlice_desc->m_num_blocks_x == pAlpha_slice_desc->m_num_blocks_x",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                      ,0x2a10,
                      "bool basist::basisu_transcoder::transcode_image_level(const void *, uint32_t, uint32_t, uint32_t, void *, uint32_t, transcoder_texture_format, uint32_t, uint32_t, basisu_transcoder_state *, uint32_t) const"
                     );
      }
      uVar2 = basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(pbVar9 + 0xb));
      uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(local_120 + 0xb));
      if (uVar2 != uVar4) {
        __assert_fail("pSlice_desc->m_num_blocks_y == pAlpha_slice_desc->m_num_blocks_y",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                      ,0x2a11,
                      "bool basist::basisu_transcoder::transcode_image_level(const void *, uint32_t, uint32_t, uint32_t, void *, uint32_t, transcoder_texture_format, uint32_t, uint32_t, basisu_transcoder_state *, uint32_t) const"
                     );
      }
      uVar2 = basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(pbVar9 + 3));
      uVar4 = basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(local_120 + 3));
      if (uVar2 != uVar4) {
        __assert_fail("pSlice_desc->m_level_index == pAlpha_slice_desc->m_level_index",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                      ,0x2a12,
                      "bool basist::basisu_transcoder::transcode_image_level(const void *, uint32_t, uint32_t, uint32_t, void *, uint32_t, transcoder_texture_format, uint32_t, uint32_t, basisu_transcoder_state *, uint32_t) const"
                     );
      }
    }
    basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(pbVar9 + 9));
    basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(pbVar9 + 0xb));
    basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(pbVar9 + 5));
    basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(pbVar9 + 7));
    basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(pbVar9 + 3));
    tVar6 = (transcoder_texture_format)((ulong)pbVar9 >> 0x20);
    basisu::packed_uint::operator_cast_to_unsigned_int
              ((packed_uint<4U> *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    basisu::packed_uint::operator_cast_to_unsigned_int
              ((packed_uint<4U> *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    if (local_120 != (basisu_lowlevel_uastc_transcoder *)0x0) {
      basisu::packed_uint::operator_cast_to_unsigned_int
                ((packed_uint<4U> *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    }
    if (local_120 != (basisu_lowlevel_uastc_transcoder *)0x0) {
      basisu::packed_uint::operator_cast_to_unsigned_int
                ((packed_uint<4U> *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    }
    basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(pbVar12 + 0x17));
    local_89 = basisu_lowlevel_etc1s_transcoder::transcode_image
                         (in_stack_ffffffffffffff68,tVar6,local_120,
                          output_blocks_buf_size_in_blocks_or_pixels_00,(uint8_t *)pbVar11,
                          in_stack_ffffffffffffff44,in_ECX,num_blocks_y,orig_width,
                          in_stack_ffffffffffffffc8,unaff_EBX,unaff_R12D,unaff_R13D,uVar3,unaff_R15D
                          ,unaff_EBP,SUB21((ushort)uVar10 >> 8,0),SUB21(uVar10,0),in_stack_00000010,
                          (basisu_transcoder_state *)CONCAT44(in_stack_0000001c,in_stack_00000018),
                          in_stack_00000020);
  }
  return local_89;
}

Assistant:

bool basisu_transcoder::transcode_image_level(
		const void* pData, uint32_t data_size,
		uint32_t image_index, uint32_t level_index,
		void* pOutput_blocks, uint32_t output_blocks_buf_size_in_blocks_or_pixels,
		transcoder_texture_format fmt,
		uint32_t decode_flags, uint32_t output_row_pitch_in_blocks_or_pixels, basisu_transcoder_state *pState, uint32_t output_rows_in_pixels) const
	{
		const uint32_t bytes_per_block_or_pixel = basis_get_bytes_per_block_or_pixel(fmt);

		if (!m_ready_to_transcode)
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::transcode_image_level: must call start_transcoding() first\n");
			return false;
		}

		//const bool transcode_alpha_data_to_opaque_formats = (decode_flags & cDecodeFlagsTranscodeAlphaDataToOpaqueFormats) != 0;

		if (decode_flags & cDecodeFlagsPVRTCDecodeToNextPow2)
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::transcode_image_level: cDecodeFlagsPVRTCDecodeToNextPow2 currently unsupported\n");
			// TODO: Not yet supported
			return false;
		}

		if (!validate_header_quick(pData, data_size))
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::transcode_image_level: header validation failed\n");
			return false;
		}

		const basis_file_header* pHeader = reinterpret_cast<const basis_file_header*>(pData);

		const uint8_t* pDataU8 = static_cast<const uint8_t*>(pData);

		const basis_slice_desc* pSlice_descs = reinterpret_cast<const basis_slice_desc*>(pDataU8 + pHeader->m_slice_desc_file_ofs);

		const bool basis_file_has_alpha_slices = (pHeader->m_flags & cBASISHeaderFlagHasAlphaSlices) != 0;

		int slice_index = find_first_slice_index(pData, data_size, image_index, level_index);
		if (slice_index < 0)
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::transcode_image_level: failed finding slice index\n");
			// Unable to find the requested image/level 
			return false;
		}

		if ((fmt == transcoder_texture_format::cTFPVRTC1_4_RGBA) && (!basis_file_has_alpha_slices))
		{
			// Switch to PVRTC1 RGB if the input doesn't have alpha.
			fmt = transcoder_texture_format::cTFPVRTC1_4_RGB;
		}
				
		if (pHeader->m_tex_format == (int)basis_tex_format::cETC1S)
		{
			if (pSlice_descs[slice_index].m_flags & cSliceDescFlagsHasAlpha)
			{
				BASISU_DEVEL_ERROR("basisu_transcoder::transcode_image_level: alpha basis file has out of order alpha slice\n");

				// The first slice shouldn't have alpha data in a properly formed basis file
				return false;
			}

			if (basis_file_has_alpha_slices)
			{
				// The alpha data should immediately follow the color data, and have the same resolution.
				if ((slice_index + 1U) >= pHeader->m_total_slices)
				{
					BASISU_DEVEL_ERROR("basisu_transcoder::transcode_image_level: alpha basis file has missing alpha slice\n");
					// basis file is missing the alpha slice
					return false;
				}

				// Basic sanity checks
				if ((pSlice_descs[slice_index + 1].m_flags & cSliceDescFlagsHasAlpha) == 0)
				{
					BASISU_DEVEL_ERROR("basisu_transcoder::transcode_image_level: alpha basis file has missing alpha slice (flag check)\n");
					// This slice should have alpha data
					return false;
				}

				if ((pSlice_descs[slice_index].m_num_blocks_x != pSlice_descs[slice_index + 1].m_num_blocks_x) || (pSlice_descs[slice_index].m_num_blocks_y != pSlice_descs[slice_index + 1].m_num_blocks_y))
				{
					BASISU_DEVEL_ERROR("basisu_transcoder::transcode_image_level: alpha basis file slice dimensions bad\n");
					// Alpha slice should have been the same res as the color slice
					return false;
				}
			}
		}
								
		bool status = false;

		const uint32_t total_slice_blocks = pSlice_descs[slice_index].m_num_blocks_x * pSlice_descs[slice_index].m_num_blocks_y;

		if (((fmt == transcoder_texture_format::cTFPVRTC1_4_RGB) || (fmt == transcoder_texture_format::cTFPVRTC1_4_RGBA)) && (output_blocks_buf_size_in_blocks_or_pixels > total_slice_blocks))
		{
			// The transcoder doesn't write beyond total_slice_blocks, so we need to clear the rest ourselves.
			// For GL usage, PVRTC1 4bpp image size is (max(width, 8)* max(height, 8) * 4 + 7) / 8. 
			// However, for KTX and internally in Basis this formula isn't used, it's just ((width+3)/4) * ((height+3)/4) * bytes_per_block_or_pixel. This is all the transcoder actually writes to memory.
			memset(static_cast<uint8_t*>(pOutput_blocks) + total_slice_blocks * bytes_per_block_or_pixel, 0, (output_blocks_buf_size_in_blocks_or_pixels - total_slice_blocks) * bytes_per_block_or_pixel);
		}
		
		if (pHeader->m_tex_format == (int)basis_tex_format::cUASTC4x4)
		{
			const basis_slice_desc* pSlice_desc = &pSlice_descs[slice_index];

			// Use the container independent image transcode method.
			status = m_lowlevel_uastc_decoder.transcode_image(fmt,
				pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels,
				(const uint8_t*)pData, data_size, pSlice_desc->m_num_blocks_x, pSlice_desc->m_num_blocks_y, pSlice_desc->m_orig_width, pSlice_desc->m_orig_height, pSlice_desc->m_level_index,
				pSlice_desc->m_file_ofs, pSlice_desc->m_file_size,
				decode_flags, basis_file_has_alpha_slices, pHeader->m_tex_type == cBASISTexTypeVideoFrames, output_row_pitch_in_blocks_or_pixels, pState, output_rows_in_pixels);
		}
		else 
		{
			// ETC1S
			const basis_slice_desc* pSlice_desc = &pSlice_descs[slice_index];
			const basis_slice_desc* pAlpha_slice_desc = basis_file_has_alpha_slices ? &pSlice_descs[slice_index + 1] : nullptr;

			assert((pSlice_desc->m_flags & cSliceDescFlagsHasAlpha) == 0);

			if (pAlpha_slice_desc)
			{
				// Basic sanity checks
				assert((pAlpha_slice_desc->m_flags & cSliceDescFlagsHasAlpha) != 0);
				assert(pSlice_desc->m_num_blocks_x == pAlpha_slice_desc->m_num_blocks_x);
				assert(pSlice_desc->m_num_blocks_y == pAlpha_slice_desc->m_num_blocks_y);
				assert(pSlice_desc->m_level_index == pAlpha_slice_desc->m_level_index);
			}

			// Use the container independent image transcode method.
			status = m_lowlevel_etc1s_decoder.transcode_image(fmt,
				pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels,
				(const uint8_t *)pData, data_size, pSlice_desc->m_num_blocks_x, pSlice_desc->m_num_blocks_y, pSlice_desc->m_orig_width, pSlice_desc->m_orig_height, pSlice_desc->m_level_index,
				pSlice_desc->m_file_ofs, pSlice_desc->m_file_size,
				(pAlpha_slice_desc != nullptr) ? (uint32_t)pAlpha_slice_desc->m_file_ofs : 0U, (pAlpha_slice_desc != nullptr) ? (uint32_t)pAlpha_slice_desc->m_file_size : 0U,
				decode_flags, basis_file_has_alpha_slices, pHeader->m_tex_type == cBASISTexTypeVideoFrames, output_row_pitch_in_blocks_or_pixels, pState, output_rows_in_pixels);

		} // if (pHeader->m_tex_format == (int)basis_tex_format::cUASTC4x4)
      
      if (!status)
      {
         BASISU_DEVEL_ERROR("basisu_transcoder::transcode_image_level: Returning false\n");
      }
      else
      {
         //BASISU_DEVEL_ERROR("basisu_transcoder::transcode_image_level: Returning true\n");      
      }

		return status;
	}